

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O3

void __thiscall
r_comp::Decompiler::write_any
          (Decompiler *this,uint16_t read_index,bool *after_tail_wildcard,bool apply_time_offset,
          uint16_t write_as_view_index)

{
  OutStream *pOVar1;
  ostringstream *poVar2;
  ImageObject *pIVar3;
  Metadata *pMVar4;
  size_type **ppsVar5;
  undefined8 uVar6;
  char cVar7;
  undefined1 uVar8;
  byte bVar9;
  short sVar10;
  ushort uVar11;
  uint16_t uVar12;
  uint uVar13;
  int iVar14;
  Atom *pAVar15;
  uint *puVar16;
  offset_in_Decompiler_to_subr *poVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  long lVar18;
  SysObject **ppSVar19;
  Class *pCVar20;
  iterator iVar21;
  code *pcVar22;
  uint64_t uVar23;
  long *plVar24;
  undefined6 in_register_00000032;
  char *pcVar25;
  ulong uVar26;
  size_t i;
  uint uVar27;
  ulong i_00;
  undefined4 uVar28;
  Atom atom;
  Atom a;
  string s;
  string member_name;
  Atom first;
  Atom local_114 [4];
  int local_110;
  byte local_109;
  Class local_108;
  string local_c0;
  key_type local_a0;
  OutStream *local_80;
  Class local_78;
  
  pAVar15 = r_code::vector<r_code::Atom>::operator[]
                      ((vector<r_code::Atom> *)(this->current_object + 8),
                       CONCAT62(in_register_00000032,read_index) & 0xffffffff);
  local_110 = *(int *)pAVar15;
  cVar7 = r_code::Atom::isFloat();
  if (cVar7 != '\0') {
    if (local_110 == 0x3fffffff) {
      OutStream::push<char[4]>(this->out_stream,(char (*) [4])"|nb",read_index);
    }
    else {
      r_code::Atom::PlusInfinity();
      cVar7 = r_code::Atom::operator==((Atom *)&local_110,&local_108.atom);
      r_code::Atom::~Atom(&local_108.atom);
      pOVar1 = this->out_stream;
      if (cVar7 == '\0') {
        poVar2 = pOVar1->stream;
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        uVar28 = r_code::Atom::asFloat();
        local_108._0_4_ = uVar28;
        OutStream::push<float>(pOVar1,(float *)&local_108,read_index);
      }
      else {
        OutStream::push<char[8]>(pOVar1,(char (*) [8])"forever",read_index);
      }
    }
    goto LAB_001331dd;
  }
  r_code::Atom::Atom(local_114,0xffffffff);
  uVar8 = r_code::Atom::getDescriptor();
  switch(uVar8) {
  case 0x80:
    pcVar25 = "nil";
    goto LAB_00132fb8;
  case 0x81:
    cVar7 = r_code::Atom::readsAsNil();
    if (cVar7 != '\0') {
      pcVar25 = "|bl";
      goto LAB_00132fb8;
    }
    pOVar1 = this->out_stream;
    poVar2 = pOVar1->stream;
    poVar2 = poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18;
    *(uint *)poVar2 = *(uint *)poVar2 | 1;
    uVar8 = r_code::Atom::asBoolean();
    local_108.atom = (Atom)uVar8;
    OutStream::push<bool>(pOVar1,(bool *)&local_108,read_index);
    break;
  case 0x82:
    if (*after_tail_wildcard == true) {
      r_code::vector<std::fpos<__mbstate_t>_>::push_back
                (&this->out_stream->positions,(fpos<__mbstate_t>)ZEXT816(0));
    }
    else {
      local_108.atom = (Atom)0x3a;
      OutStream::push<char>(this->out_stream,(char *)&local_108,read_index);
    }
    break;
  case 0x83:
    OutStream::push<char[3]>(this->out_stream,(char (*) [3])"::",read_index);
    *after_tail_wildcard = true;
    break;
  case 0x84:
    goto switchD_00132e27_caseD_84;
  case 0x85:
    pOVar1 = this->out_stream;
    pIVar3 = this->current_object;
    uVar11 = r_code::Atom::asIndex();
    puVar16 = r_code::vector<unsigned_int>::operator[]
                        ((vector<unsigned_int> *)(pIVar3 + 0x20),(ulong)uVar11);
    get_object_name_abi_cxx11_((string *)&local_108,this,(uint16_t)*puVar16);
    OutStream::push<std::__cxx11::string>
              (pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_108,read_index);
    goto LAB_001330fc;
  case 0x86:
    bVar9 = this->in_hlp;
    if ((bool)bVar9 != true) goto LAB_00133002;
    sVar10 = r_code::Atom::asCastOpcode();
    if (sVar10 != 0xffe) {
      uVar12 = r_code::Atom::asIndex();
      get_hlp_variable_name_abi_cxx11_((string *)&local_108,this,uVar12);
      OutStream::push<std::__cxx11::string>
                (this->out_stream,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
                 read_index);
      goto LAB_001330fc;
    }
    local_108.atom = (Atom)0x3a;
    OutStream::push<char>(this->out_stream,(char *)&local_108,read_index);
    break;
  default:
    goto switchD_00132e27_caseD_87;
  case 0x8d:
    bVar9 = this->in_hlp;
LAB_00133002:
    if ((bVar9 & 1) != 0) {
      pOVar1 = this->out_stream;
      bVar9 = r_code::Atom::asAssignmentIndex();
      get_hlp_variable_name_abi_cxx11_((string *)&local_108,this,(ushort)bVar9);
      OutStream::push<std::__cxx11::string>
                (pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_108,read_index);
      if ((size_type *)local_108._0_8_ != &local_108.str_opcode._M_string_length) {
        operator_delete((void *)local_108._0_8_);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->out_stream->stream,":",1);
    }
switchD_00132e27_caseD_84:
    uVar11 = r_code::Atom::asIndex();
    pAVar15 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)uVar11);
    r_code::Atom::operator=(local_114,pAVar15);
    while (cVar7 = r_code::Atom::getDescriptor(), cVar7 == -0x7c) {
      uVar11 = r_code::Atom::asIndex();
      pAVar15 = r_code::vector<r_code::Atom>::operator[]
                          ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)uVar11);
      r_code::Atom::operator=(local_114,pAVar15);
    }
    i_00 = (ulong)uVar11;
    uVar27 = (uint)uVar11;
    if (uVar11 < read_index) {
      cVar7 = r_code::Atom::getDescriptor();
      get_variable_name_abi_cxx11_((string *)&local_108,this,uVar11,cVar7 != -0x7e);
      OutStream::push<std::__cxx11::string>
                (this->out_stream,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
                 read_index);
LAB_001330fc:
      if ((size_type *)local_108._0_8_ != &local_108.str_opcode._M_string_length) {
        operator_delete((void *)local_108._0_8_);
      }
    }
    else {
      uVar8 = r_code::Atom::getDescriptor();
      switch(uVar8) {
      case 0xc0:
        bVar9 = r_code::Atom::getAtomCount();
        pAVar15 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(uVar27 + 1))
        ;
        r_code::Atom::operator=(local_114,pAVar15);
        cVar7 = r_code::Atom::getDescriptor();
        if (cVar7 == -0x7b) {
          pIVar3 = this->current_object;
          uVar11 = r_code::Atom::asIndex();
          puVar16 = r_code::vector<unsigned_int>::operator[]
                              ((vector<unsigned_int> *)(pIVar3 + 0x20),(ulong)uVar11);
          uVar13 = *puVar16;
          pOVar1 = this->out_stream;
          get_object_name_abi_cxx11_((string *)&local_108,this,(uint16_t)uVar13);
          OutStream::push<std::__cxx11::string>
                    (pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_108,read_index);
          if ((size_type *)local_108._0_8_ != &local_108.str_opcode._M_string_length) {
            operator_delete((void *)local_108._0_8_);
          }
          ppSVar19 = r_code::vector<r_code::SysObject_*>::operator[]
                               (&(this->image->code_segment).objects,(ulong)uVar13);
          r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(*ppSVar19 + 8),0);
          uVar13 = r_code::Atom::asOpcode();
LAB_001336c6:
          uVar26 = (ulong)uVar13;
        }
        else if (cVar7 == -0x7a) {
          uVar13 = r_code::Atom::asCastOpcode();
          local_109 = bVar9;
          while( true ) {
            pIVar3 = this->current_object;
            uVar11 = r_code::Atom::asIndex();
            r_code::vector<r_code::Atom>::operator[]
                      ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar11);
            cVar7 = r_code::Atom::getDescriptor();
            if (cVar7 != -0x7c) break;
            pIVar3 = this->current_object;
            uVar11 = r_code::Atom::asIndex();
            pAVar15 = r_code::vector<r_code::Atom>::operator[]
                                ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar11);
            r_code::Atom::operator=(local_114,pAVar15);
          }
          local_80 = this->out_stream;
          uVar12 = r_code::Atom::asIndex();
          pIVar3 = this->current_object;
          uVar11 = r_code::Atom::asIndex();
          r_code::vector<r_code::Atom>::operator[]
                    ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar11);
          cVar7 = r_code::Atom::getDescriptor();
          get_variable_name_abi_cxx11_((string *)&local_108,this,uVar12,cVar7 != -0x7e);
          OutStream::push<std::__cxx11::string>
                    (local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_108,read_index);
          bVar9 = local_109;
          if ((size_type *)local_108._0_8_ != &local_108.str_opcode._M_string_length) {
            operator_delete((void *)local_108._0_8_);
          }
          uVar26 = (ulong)(uVar13 & 0xff);
          if ((uVar13 & 0xff) == 0xff) {
            pIVar3 = this->current_object;
            uVar11 = r_code::Atom::asIndex();
            r_code::vector<r_code::Atom>::operator[]
                      ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar11);
            r_code::Atom::getDescriptor();
            pIVar3 = this->current_object;
            uVar11 = r_code::Atom::asIndex();
            r_code::vector<r_code::Atom>::operator[]
                      ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar11);
            uVar13 = r_code::Atom::asOpcode();
            goto LAB_001336c6;
          }
        }
        else {
          if (cVar7 != -0x70) {
            OutStream::push<char[23]>
                      (this->out_stream,(char (*) [23])"unknown-cptr-lead-type",read_index);
            break;
          }
          OutStream::push<char[5]>(this->out_stream,(char (*) [5])"this",read_index);
          pMVar4 = this->metadata;
          uVar6 = &local_108.str_opcode._M_string_length;
          local_108._0_8_ = uVar6;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ipgm","");
          std::__detail::
          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)&pMVar4->sys_classes,(key_type *)&local_108);
          uVar13 = r_code::Atom::asOpcode();
          uVar26 = (ulong)uVar13;
          if (local_108._0_8_ != uVar6) {
            operator_delete((void *)local_108._0_8_);
          }
        }
        pCVar20 = r_code::vector<r_comp::Class>::operator[]
                            (&this->metadata->classes_by_opcodes,uVar26 & 0xffff);
        Class::Class(&local_108,pCVar20);
        if (1 < bVar9) {
          i = i_00 + 2;
          uVar13 = 2;
          do {
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            local_c0._M_string_length = 0;
            local_c0.field_2._M_local_buf[0] = '\0';
            pAVar15 = r_code::vector<r_code::Atom>::operator[]
                                ((vector<r_code::Atom> *)(this->current_object + 8),i);
            r_code::Atom::operator=(local_114,pAVar15);
            cVar7 = r_code::Atom::getDescriptor();
            if ((byte)(cVar7 + 0x6fU) < 3) {
              std::__cxx11::string::operator=
                        ((string *)&local_c0,
                         &DAT_0013eca8 + *(int *)(&DAT_0013eca8 + (ulong)(byte)(cVar7 + 0x6fU) * 4))
              ;
            }
            else {
              uVar11 = r_code::Atom::asIndex();
              Class::get_member_name_abi_cxx11_((string *)&local_78,&local_108,(ulong)uVar11);
              std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_78);
              if ((size_type *)CONCAT44(local_78._4_4_,local_78._0_4_) !=
                  &local_78.str_opcode._M_string_length) {
                operator_delete((undefined1 *)CONCAT44(local_78._4_4_,local_78._0_4_));
              }
              if (uVar13 < bVar9) {
                pCVar20 = Class::get_member_class(&local_108,this->metadata,&local_c0);
                Class::operator=(&local_108,pCVar20);
              }
            }
            pOVar1 = this->out_stream;
            local_78.atom = (Atom)0x2e;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pOVar1->stream,(char *)&local_78,1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pOVar1->stream,local_c0._M_dataplus._M_p,local_c0._M_string_length
                      );
            iVar14 = std::__cxx11::string::compare((char *)&local_c0);
            if (iVar14 == 0) {
              pAVar15 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(this->current_object + 8),
                                   (ulong)(bVar9 + uVar27));
              r_code::Atom::operator=(local_114,pAVar15);
              Class::Class(&local_78,ANY);
              ppsVar5 = (size_type **)&local_108.str_opcode;
              iVar14 = std::__cxx11::string::compare((char *)ppsVar5);
              if (iVar14 == 0) {
                pMVar4 = this->metadata;
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"grp_view","");
                iVar21 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)pMVar4,&local_a0);
                Class::operator=(&local_78,
                                 (Class *)((long)iVar21.
                                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                                 ._M_cur + 0x28));
LAB_001339dc:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p);
                }
              }
              else {
                iVar14 = std::__cxx11::string::compare((char *)ppsVar5);
                if ((((iVar14 == 0) ||
                     (iVar14 = std::__cxx11::string::compare((char *)ppsVar5), iVar14 == 0)) ||
                    (iVar14 = std::__cxx11::string::compare((char *)ppsVar5), iVar14 == 0)) ||
                   (iVar14 = std::__cxx11::string::compare((char *)ppsVar5), iVar14 == 0)) {
                  pMVar4 = this->metadata;
                  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"pgm_view","")
                  ;
                  iVar21 = std::
                           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                   *)pMVar4,&local_a0);
                  Class::operator=(&local_78,
                                   (Class *)((long)iVar21.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                                  ._M_cur + 0x28));
                  goto LAB_001339dc;
                }
                pMVar4 = this->metadata;
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"view","");
                iVar21 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)pMVar4,&local_a0);
                Class::operator=(&local_78,
                                 (Class *)((long)iVar21.
                                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                                 ._M_cur + 0x28));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p);
                }
              }
              uVar11 = r_code::Atom::asIndex();
              Class::get_member_name_abi_cxx11_(&local_a0,&local_78,(ulong)uVar11);
              std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p);
              }
              pOVar1 = this->out_stream;
              local_a0._M_dataplus._M_p._0_1_ = 0x2e;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pOVar1->stream,(char *)&local_a0,1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pOVar1->stream,local_c0._M_dataplus._M_p,
                         local_c0._M_string_length);
              Class::~Class(&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p);
              }
              break;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p);
            }
            i = i + 1;
            uVar11 = (ushort)uVar13;
            uVar13 = uVar13 + 1;
          } while (uVar11 < bVar9);
        }
        Class::~Class(&local_108);
        break;
      case 0xc1:
      case 0xc2:
        cVar7 = r_code::Atom::readsAsNil();
        if (cVar7 != '\0') {
          pcVar25 = "|[]";
          goto LAB_00132fb8;
        }
        write_set(this,uVar11,apply_time_offset,write_as_view_index);
        break;
      case 0xc3:
      case 0xc4:
      case 0xc5:
      case 200:
      case 0xc9:
      case 0xca:
      case 0xcb:
      case 0xcc:
      case 0xcd:
      case 0xce:
        uVar11 = r_code::Atom::asOpcode();
        poVar17 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                            (&this->renderers,(ulong)uVar11);
        pcVar22 = (code *)*poVar17;
        plVar24 = (long *)((long)&this->out_stream + poVar17[1]);
        if (((ulong)pcVar22 & 1) != 0) {
          pcVar22 = *(code **)(pcVar22 + *plVar24 + -1);
        }
        (*pcVar22)(plVar24,i_00);
        break;
      case 0xc6:
        cVar7 = r_code::Atom::readsAsNil();
        if (cVar7 != '\0') {
          pcVar25 = "|st";
          goto LAB_00132fb8;
        }
        pAVar15 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(uVar27 + 1))
        ;
        local_78._0_4_ = *(undefined4 *)pAVar15;
        r_code::vector<r_code::Atom>::operator[]
                  ((vector<r_code::Atom> *)(this->current_object + 8),i_00);
        r_code::Utils::GetString_abi_cxx11_(&local_108.atom);
        pOVar1 = this->out_stream;
        local_c0._M_dataplus._M_p._0_1_ = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pOVar1->stream,(char *)&local_c0,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pOVar1->stream,(char *)local_108._0_8_,
                   (long)local_108.str_opcode._M_dataplus._M_p);
        local_c0._M_dataplus._M_p._0_1_ = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pOVar1->stream,(char *)&local_c0,1);
        if ((size_type *)local_108._0_8_ != &local_108.str_opcode._M_string_length) {
          operator_delete((void *)local_108._0_8_);
        }
        r_code::Atom::~Atom(&local_78.atom);
        break;
      case 199:
        cVar7 = r_code::Atom::readsAsNil();
        if (cVar7 == '\0') {
          pAVar15 = r_code::vector<r_code::Atom>::operator[]
                              ((vector<r_code::Atom> *)(this->current_object + 8),i_00);
          lVar18 = r_code::Utils::GetTimestamp(pAVar15);
          uVar23 = 0;
          if (apply_time_offset) {
            uVar23 = this->time_offset;
          }
          if (this->in_hlp != false) {
            uVar23 = 0;
          }
          if (lVar18 == 0) {
            uVar23 = 0;
          }
          pOVar1 = this->out_stream;
          DebugStream::timestamp_abi_cxx11_((string *)&local_108,(DebugStream *)(lVar18 - uVar23),0)
          ;
          OutStream::push<std::__cxx11::string>
                    (pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_108,read_index);
          goto LAB_001330fc;
        }
        pcVar25 = "|us";
        goto LAB_00132fb8;
      default:
        OutStream::push<char[39]>
                  (this->out_stream,(char (*) [39])"undefined-structural-atom-or-reference",
                   read_index);
      }
    }
    break;
  case 0x90:
    pcVar25 = "this";
LAB_001331c8:
    OutStream::push<char[5]>(this->out_stream,(char (*) [5])pcVar25,read_index);
    break;
  case 0x91:
    OutStream::push<char[3]>(this->out_stream,(char (*) [3])"vw",read_index);
    break;
  case 0x92:
    pcVar25 = "mks";
    goto LAB_00132fb8;
  case 0x93:
    pcVar25 = "vws";
LAB_00132fb8:
    OutStream::push<char[4]>(this->out_stream,(char (*) [4])pcVar25,read_index);
    break;
  case 0xa0:
    cVar7 = r_code::Atom::readsAsNil();
    if (cVar7 != '\0') {
      pcVar25 = "|sid";
      goto LAB_001331c8;
    }
    goto switchD_00132e27_caseD_87;
  case 0xa1:
    cVar7 = r_code::Atom::readsAsNil();
    if (cVar7 != '\0') {
      pcVar25 = "|did";
      goto LAB_001331c8;
    }
switchD_00132e27_caseD_87:
    OutStream::push<char[3]>(this->out_stream,(char (*) [3])"0x",read_index);
    poVar2 = this->out_stream->stream;
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    break;
  case 0xa2:
    cVar7 = r_code::Atom::readsAsNil();
    if (cVar7 != '\0') {
      pcVar25 = "|fid";
      goto LAB_001331c8;
    }
    pOVar1 = this->out_stream;
    pMVar4 = this->metadata;
    uVar11 = r_code::Atom::asOpcode();
    t = r_code::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator[](&pMVar4->function_names,(ulong)uVar11);
    OutStream::push<std::__cxx11::string>(pOVar1,t,read_index);
  }
  r_code::Atom::~Atom(local_114);
LAB_001331dd:
  r_code::Atom::~Atom((Atom *)&local_110);
  return;
}

Assistant:

void Decompiler::write_any(uint16_t read_index, bool &after_tail_wildcard, bool apply_time_offset, uint16_t write_as_view_index)   // after_tail_wildcard meant to avoid printing ':' after "::".
{
    Atom a = current_object->code[read_index];

    if (a.isFloat()) {
        if (a.atom == 0x3FFFFFFF) {
            out_stream->push("|nb", read_index);
        } else if (a == Atom::PlusInfinity()) {
            out_stream->push("forever", read_index);
        } else {
            *out_stream << std::dec;
            out_stream->push(a.asFloat(), read_index);
        }

        return;
    }

    Atom atom;
    uint16_t index;

    switch (a.getDescriptor()) {
    case Atom::VL_PTR:
        if (in_hlp) {
            if (a.asCastOpcode() == 0x0FFE) {
                out_stream->push(':', read_index);
            } else {
                std::string s = get_hlp_variable_name(a.asIndex());
                out_stream->push(s, read_index);
            }

            break;
        }

    case Atom::ASSIGN_PTR:
        if (in_hlp) {
            out_stream->push(get_hlp_variable_name(a.asAssignmentIndex()), read_index);
            *out_stream << ":";
        }

    case Atom::I_PTR:
        index = a.asIndex();
        atom = current_object->code[index];

        while (atom.getDescriptor() == Atom::I_PTR) {
            index = atom.asIndex();
            atom = current_object->code[index];
        }

        if (index < read_index) { // reference to a label or variable.
            std::string s = get_variable_name(index, atom.getDescriptor() != Atom::WILDCARD); // post-fix labels with ':' (no need for variables since they are inserted just before wildcards).
            out_stream->push(s, read_index);
            break;
        }

        switch (atom.getDescriptor()) { // structures.
        case Atom::OBJECT:
        case Atom::MARKER:
        case Atom::GROUP:
        case Atom::INSTANTIATED_PROGRAM:
        case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
        case Atom::INSTANTIATED_ANTI_PROGRAM:
        case Atom::INSTANTIATED_CPP_PROGRAM:
        case Atom::COMPOSITE_STATE:
        case Atom::MODEL:
        case Atom::OPERATOR:
            (this->*renderers[atom.asOpcode()])(index);
            break;

        case Atom::SET:
        case Atom::S_SET:
            if (atom.readsAsNil()) {
                out_stream->push("|[]", read_index);
            } else {
                write_set(index, apply_time_offset, write_as_view_index);
            }

            break;

        case Atom::STRING:
            if (atom.readsAsNil()) {
                out_stream->push("|st", read_index);
            } else {
                Atom first = current_object->code[index + 1];
                std::string s = Utils::GetString(&current_object->code[index]);
                *out_stream << '\"' << s << '\"';
            }

            break;

        case Atom::TIMESTAMP:
            if (atom.readsAsNil()) {
                out_stream->push("|us", read_index);
            } else {
                uint64_t ts = Utils::GetTimestamp(&current_object->code[index]);

                if (!in_hlp && ts > 0 && apply_time_offset) {
                    ts -= time_offset;
                }

                out_stream->push(DebugStream::timestamp(ts), read_index);
            }

            break;

        case Atom::C_PTR: {
            uint16_t opcode;
            uint16_t member_count = atom.getAtomCount();
            atom = current_object->code[index + 1]; // current_object->code[index] is the cptr; lead atom is at index+1; iptrs start at index+2.

            switch (atom.getDescriptor()) {
            case Atom::THIS: // this always refers to an instantiated reactive object.
                out_stream->push("this", read_index);
                opcode = metadata->sys_classes["ipgm"].atom.asOpcode();
                break;

            case Atom::VL_PTR: {
                uint8_t cast_opcode = atom.asCastOpcode();

                while (current_object->code[atom.asIndex()].getDescriptor() == Atom::I_PTR) { // position to a structure or an atomic value.
                    atom = current_object->code[atom.asIndex()];
                }

                out_stream->push(get_variable_name(atom.asIndex(), current_object->code[atom.asIndex()].getDescriptor() != Atom::WILDCARD), read_index);

                if (cast_opcode == 0xFF) {
                    if (current_object->code[atom.asIndex()].getDescriptor() == Atom::WILDCARD) {
                        opcode = current_object->code[atom.asIndex()].asOpcode();
                    } else {
                        opcode = current_object->code[atom.asIndex()].asOpcode();
                    }
                } else {
                    opcode = cast_opcode;
                }

                break;
            }

            case Atom::R_PTR: {
                uint64_t object_index = current_object->references[atom.asIndex()];
                out_stream->push(get_object_name(object_index), read_index);
                opcode = image->code_segment.objects[object_index]->code[0].asOpcode();
                break;
            }

            default:
                out_stream->push("unknown-cptr-lead-type", read_index);
                return;
            }

            Class embedding_class = metadata->classes_by_opcodes[opcode]; // class defining the members.

            for (uint16_t i = 2; i <= member_count; ++i) { // get the class of the pointed structure and retrieve the member name from i.
                std::string member_name;
                atom = current_object->code[index + i]; // atom is an iptr appearing after the leading atom in the cptr.

                switch (atom.getDescriptor()) {
                case Atom::VIEW:
                    member_name = "vw";
                    break;

                case Atom::MKS:
                    member_name = "mks";
                    break;

                case Atom::VWS:
                    member_name = "vws";
                    break;

                default:
                    member_name = embedding_class.get_member_name(atom.asIndex());

                    if (i < member_count) { // not the last member, get the next class.
                        embedding_class = *embedding_class.get_member_class(metadata, member_name);
                    }

                    break;
                }

                *out_stream << '.' << member_name;

                if (member_name == "vw") { // special case: no view structure in the code, vw is just a place holder; vw is the second to last member of the cptr: write the last member and exit.
                    atom = current_object->code[index + member_count]; // atom is the last internal pointer.
                    Class view_class;

                    if (embedding_class.str_opcode == "grp") {
                        view_class = metadata->classes.find("grp_view")->second;
                    } else if (embedding_class.str_opcode == "ipgm" ||
                               embedding_class.str_opcode == "icpp_pgm" ||
                               embedding_class.str_opcode == "mdl" ||
                               embedding_class.str_opcode == "cst") {
                        view_class = metadata->classes.find("pgm_view")->second;
                    } else {
                        view_class = metadata->classes.find("view")->second;
                    }

                    member_name = view_class.get_member_name(atom.asIndex());
                    *out_stream << '.' << member_name;
                    break;
                }
            }

            break;
        }

        default:
            out_stream->push("undefined-structural-atom-or-reference", read_index);
            break;
        }

        break;

    case Atom::R_PTR:
        out_stream->push(get_object_name(current_object->references[a.asIndex()]), read_index);
        break;

    case Atom::THIS:
        out_stream->push("this", read_index);
        break;

    case Atom::NIL:
        out_stream->push("nil", read_index);
        break;

    case Atom::BOOLEAN_:
        if (a.readsAsNil()) {
            out_stream->push("|bl", read_index);
        } else {
            *out_stream << std::boolalpha;
            out_stream->push(a.asBoolean(), read_index);
        }

        break;

    case Atom::WILDCARD:
        if (after_tail_wildcard) {
            out_stream->push();
        } else {
            out_stream->push(':', read_index);
        }

        break;

    case Atom::T_WILDCARD:
        out_stream->push("::", read_index);
        after_tail_wildcard = true;
        break;

    case Atom::NODE:
        if (a.readsAsNil()) {
            out_stream->push("|sid", read_index);
        } else {
            out_stream->push("0x", read_index);
            *out_stream << std::hex;
            *out_stream << a.atom;
        }

        break;

    case Atom::DEVICE:
        if (a.readsAsNil()) {
            out_stream->push("|did", read_index);
        } else {
            out_stream->push("0x", read_index);
            *out_stream << std::hex;
            *out_stream << a.atom;
        }

        break;

    case Atom::DEVICE_FUNCTION:
        if (a.readsAsNil()) {
            out_stream->push("|fid", read_index);
        } else {
            out_stream->push(metadata->function_names[a.asOpcode()], read_index);
        }

        break;

    case Atom::VIEW:
        out_stream->push("vw", read_index);
        break;

    case Atom::MKS:
        out_stream->push("mks", read_index);
        break;

    case Atom::VWS:
        out_stream->push("vws", read_index);
        break;

    default:
        // out_stream->push("undefined-atom",read_index).
        out_stream->push("0x", read_index);
        *out_stream << std::hex;
        *out_stream << a.atom;
        break;
    }
}